

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O2

Var __thiscall Js::SCACore::Deserializer::ReadValue(Deserializer *this)

{
  ScriptContext *scriptContext;
  Var pvVar1;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_88 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_48 [8];
  EnterScriptObject __enterScriptObject;
  
  scriptContext = (this->m_streamReader).super_ScriptContextHolder.m_scriptContext;
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_48,scriptContext,(ScriptEntryExitRecord *)auStack_88,
             unaff_retaddr,&stack0x00000000,true,false,false);
  ScriptContext::OnScriptStart(scriptContext,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_48);
  pvVar1 = SCADeserializationEngine::Deserialize
                     (&this->m_streamReader,this->m_transferableVars,this->m_cTransferableVars);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_48);
  return pvVar1;
}

Assistant:

Var Deserializer::ReadValue()
        {
            Var returnedValue = nullptr;
            ScriptContext *scriptContext = m_streamReader.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                returnedValue = Js::SCADeserializationEngine::Deserialize(&m_streamReader, m_transferableVars, m_cTransferableVars);
            }
            END_JS_RUNTIME_CALL(scriptContext)
                return returnedValue;
        }